

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QUnicodeTables::convertCase<QString_const>
          (QString *__return_storage_ptr__,QUnicodeTables *this,QString *str,Case which)

{
  const_iterator pQVar1;
  long lVar2;
  Data *pDVar3;
  uint uVar4;
  QStringIterator it;
  char16_t *pcVar5;
  long lVar6;
  QString *pQVar7;
  long lVar8;
  const_iterator pQVar9;
  uint uVar10;
  const_iterator pQVar11;
  const_iterator pQVar12;
  const_iterator pQVar13;
  uint uVar14;
  long in_FS_OFFSET;
  
  pQVar7 = *(QString **)(in_FS_OFFSET + 0x28);
  pQVar1 = *(const_iterator *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  lVar6 = lVar2 * 2;
  do {
    lVar8 = lVar6;
    pQVar9 = pQVar1;
    if (lVar8 == 0) goto LAB_0012814a;
    lVar6 = lVar8 + -2;
  } while ((*(ushort *)((long)&pQVar1[-1].ucs + lVar8) & 0xfc00) == 0xd800);
  pQVar9 = (const_iterator)((long)&pQVar1->ucs + lVar8);
LAB_0012814a:
  pQVar11 = pQVar1;
  do {
    if (pQVar9 <= pQVar11) {
      pDVar3 = *(Data **)this;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = &pQVar1->ucs;
      (__return_storage_ptr__->d).size = lVar2;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (*(QString **)(in_FS_OFFSET + 0x28) == pQVar7) {
        return *(QString **)(in_FS_OFFSET + 0x28);
      }
      goto LAB_001282f2;
    }
    pQVar12 = pQVar11 + 1;
    uVar14 = (uint)(ushort)pQVar11->ucs;
    uVar10 = uVar14;
    if (((((uVar14 & 0xf800) == 0xd800) && (uVar10 = 0xfffd, (pQVar11->ucs & 0xdc00U) == 0xd800)) &&
        (pQVar12 < pQVar9)) && (pcVar5 = &pQVar12->ucs, (*pcVar5 & 0xfc00U) == 0xdc00)) {
      pQVar12 = pQVar11 + 2;
      uVar10 = uVar14 * 0x400 + (uint)(ushort)*pcVar5 + 0xfca02400;
    }
    uVar14 = 0xff;
    if (uVar10 < 0x11000) {
      uVar14 = 0x1f;
    }
    uVar4 = uVar10 >> 5;
    if (0x10fff < uVar10) {
      uVar4 = (uVar10 - 0x11000 >> 8) + 0x880;
    }
    pQVar11 = pQVar12;
  } while (*(ushort *)
            ((ulong)*(ushort *)
                     (uc_property_trie +
                     (ulong)((uVar14 & uVar10) +
                            (uint)*(ushort *)(uc_property_trie + (ulong)uVar4 * 2)) * 2) * 0x14 +
             0x16af68 + ((ulong)str & 0xffffffff) * 2) < 2);
  pQVar11 = pQVar12 + -1;
  pQVar13 = pQVar11;
  if ((((pQVar12[-1].ucs & 0xfc00U) == 0xdc00) && (pQVar13 = pQVar1, pQVar11 != pQVar1)) &&
     (pQVar13 = pQVar11, (pQVar12[-2].ucs & 0xfc00U) == 0xd800)) {
    pQVar13 = pQVar12 + -2;
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == pQVar7) {
    it.pos = pQVar13;
    it.i = pQVar1;
    it.e = pQVar9;
    pQVar7 = detachAndConvertCase<QString_const>(__return_storage_ptr__,this,str,it,(Case)pQVar9);
    return pQVar7;
  }
LAB_001282f2:
  __stack_chk_fail();
}

Assistant:

static QString convertCase(T &str, QUnicodeTables::Case which)
{
    const QChar *p = str.constBegin();
    const QChar *e = p + str.size();

    // this avoids out of bounds check in the loop
    while (e != p && e[-1].isHighSurrogate())
        --e;

    QStringIterator it(p, e);
    while (it.hasNext()) {
        const char32_t uc = it.next();
        if (qGetProp(uc)->cases[which].diff) {
            it.recede();
            return detachAndConvertCase(str, it, which);
        }
    }
    return std::move(str);
}